

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

int __thiscall
glcts::LayoutBindingBaseCase::bind
          (LayoutBindingBaseCase *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  mapped_type *ppTVar4;
  mapped_type *ppTVar5;
  mapped_type *ppTVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 uVar7;
  key_type_conflict local_2c [3];
  
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  iVar2 = *(int *)(CONCAT44(extraout_var,iVar2) + 0xc);
  if (iVar2 == 5) {
    local_2c[1] = 0;
    ppTVar6 = std::
              map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
              ::operator[](&this->m_textures2DArray,local_2c + 1);
    dVar3 = (*ppTVar6)->m_glTexture;
    uVar7 = 0x8c1a;
  }
  else if (iVar2 == 3) {
    local_2c[0] = 0;
    ppTVar5 = std::
              map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
              ::operator[](&this->m_textures3D,local_2c);
    dVar3 = (*ppTVar5)->m_glTexture;
    uVar7 = 0x806f;
  }
  else {
    uVar7 = 0;
    dVar3 = 0;
    if (iVar2 == 2) {
      local_2c[2] = 0;
      ppTVar4 = std::
                map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
                ::operator[](&this->m_textures2D,local_2c + 2);
      dVar3 = (*ppTVar4)->m_glTexture;
      uVar7 = 0xde1;
    }
  }
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 8);
  if (iVar2 == 2) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    iVar2 = (**(code **)(CONCAT44(extraout_var_07,iVar2) + 0x80))(__fd,dVar3,0,0,0,35000,0x8058);
  }
  else if (iVar2 == 1) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar2) + 8))(__fd + 0x84c0);
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_02,iVar2) + 0xb8))(uVar7,dVar3);
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pcVar1 = *(code **)(CONCAT44(extraout_var_03,iVar2) + 0x1360);
    dVar3 = glu::getGLWrapMode(CLAMP_TO_EDGE);
    (*pcVar1)(uVar7,0x2802,dVar3);
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pcVar1 = *(code **)(CONCAT44(extraout_var_04,iVar2) + 0x1360);
    dVar3 = glu::getGLWrapMode(CLAMP_TO_EDGE);
    (*pcVar1)(uVar7,0x2803,dVar3);
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pcVar1 = *(code **)(CONCAT44(extraout_var_05,iVar2) + 0x1360);
    dVar3 = glu::getGLFilterMode(NEAREST);
    (*pcVar1)(uVar7,0x2801,dVar3);
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pcVar1 = *(code **)(CONCAT44(extraout_var_06,iVar2) + 0x1360);
    dVar3 = glu::getGLFilterMode(NEAREST);
    iVar2 = (*pcVar1)(uVar7,0x2800,dVar3);
  }
  return iVar2;
}

Assistant:

virtual void bind(int binding)
	{
		glw::GLint texTarget = 0;
		glw::GLint texName   = 0;

		switch (getTestParameters().texture_type)
		{
		case TwoD:
			texTarget = GL_TEXTURE_2D;
			texName   = m_textures2D[0]->getGLTexture();
			break;
		case TwoDArray:
			texTarget = GL_TEXTURE_2D_ARRAY;
			texName   = m_textures2DArray[0]->getGLTexture();
			break;
		case ThreeD:
			texTarget = GL_TEXTURE_3D;
			texName   = m_textures3D[0]->getGLTexture();
			break;
		default:
			DE_ASSERT(0);
			break;
		}

		switch (getTestParameters().surface_type)
		{
		case Texture:
			gl().activeTexture(GL_TEXTURE0 + binding);
			gl().bindTexture(texTarget, texName);
			gl().texParameteri(texTarget, GL_TEXTURE_WRAP_S, glu::getGLWrapMode(tcu::Sampler::CLAMP_TO_EDGE));
			gl().texParameteri(texTarget, GL_TEXTURE_WRAP_T, glu::getGLWrapMode(tcu::Sampler::CLAMP_TO_EDGE));
			gl().texParameteri(texTarget, GL_TEXTURE_MIN_FILTER, glu::getGLFilterMode(tcu::Sampler::NEAREST));
			gl().texParameteri(texTarget, GL_TEXTURE_MAG_FILTER, glu::getGLFilterMode(tcu::Sampler::NEAREST));
			break;
		case Image:
			gl().bindImageTexture(binding, texName, 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA8);
			break;
		default:
			DE_ASSERT(0);
			break;
		}
	}